

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal_suite.cpp
# Opt level: O0

void test_real(void)

{
  undefined1 local_129;
  iterator local_128;
  iterator local_110;
  iterator local_f8;
  undefined1 local_da [2];
  undefined1 local_d8 [8];
  variable bravo;
  undefined1 local_99;
  iterator local_98;
  iterator local_80;
  iterator local_58;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable alpha;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_38,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_58,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_80,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_98,(basic_variable<std::allocator<char>_> *)local_38);
  local_3a[0] = std::
                equal<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                          (&local_58,&local_80,&local_98);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::equal(alpha.begin(), alpha.end(), alpha.begin())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_suite.cpp"
             ,0x37,"void test_real()",local_3a,&local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_80);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_58);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_d8,0.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_f8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_110,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_128,(basic_variable<std::allocator<char>_> *)local_d8);
  local_da[0] = std::
                equal<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                          (&local_f8,&local_110,&local_128);
  local_129 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::equal(alpha.begin(), alpha.end(), bravo.begin())","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_suite.cpp"
             ,0x3a,"void test_real()",local_da,&local_129);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_110);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void test_real()
{
    variable alpha(3.0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::equal(alpha.begin(), alpha.end(), alpha.begin()),
                              true);
    variable bravo(0.0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::equal(alpha.begin(), alpha.end(), bravo.begin()),
                              false);
}